

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O2

int __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)0>::Get
          (CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)0> *this,uint inputChar)

{
  long lVar1;
  
  if (this->map[0] == inputChar) {
    lVar1 = 0x14;
  }
  else if (this->map[1] == inputChar) {
    lVar1 = 0x18;
  }
  else if (this->map[2] == inputChar) {
    lVar1 = 0x1c;
  }
  else {
    lVar1 = (ulong)(this->map[3] == inputChar) << 5;
  }
  return *(int *)((long)this->map + lVar1 + -4);
}

Assistant:

inline V Get(uint inputChar) const
        {
            if (map[0] == inputChar)
                return lastOcc[0];
            if (map[1] == inputChar)
                return lastOcc[1];
            if (map[2] == inputChar)
                return lastOcc[2];
            if (map[3] == inputChar)
                return lastOcc[3];
            return defv;
        }